

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O3

void handleTotalMassOptions(KinDynComputations *comp,parser *cmd)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  double dVar7;
  double local_50;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"total-mass","");
  bVar1 = cmdline::parser::exist(cmd,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    lVar2 = iDynTree::KinDynComputations::getRobotModel();
    lVar3 = iDynTree::Model::getNrOfLinks();
    if (lVar3 == 0) {
      local_50 = 0.0;
    }
    else {
      local_50 = 0.0;
      uVar6 = 0;
      do {
        iDynTree::Model::getLink(lVar2);
        iDynTree::Link::getInertia();
        dVar7 = (double)iDynTree::SpatialInertia::getMass();
        local_50 = local_50 + dVar7;
        uVar6 = uVar6 + 1;
        uVar4 = iDynTree::Model::getNrOfLinks();
      } while (uVar6 < uVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The total mass of model is ",0x1b);
    poVar5 = std::ostream::_M_insert<double>(local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Kg.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  return;
}

Assistant:

void handleTotalMassOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    if( !cmd.exist("total-mass") )
    {
        return;
    }

    double totalMass = 0.0;

    const iDynTree::Model & model = comp.getRobotModel();

    for(size_t l=0; l < model.getNrOfLinks(); l++)
    {
        totalMass += model.getLink(l)->getInertia().getMass();
    }

    std::cout << "The total mass of model is "
                  << totalMass << " Kg." << std::endl;
}